

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_event.c
# Opt level: O2

void te_adjust_thresholds_helper(tsd_t *tsd,te_ctx_t *ctx,uint64_t wait)

{
  uint64_t uVar1;
  
  uVar1 = 0x400000;
  if (wait < 0x400000) {
    uVar1 = wait;
  }
  *ctx->next_event = uVar1 + *ctx->last_event;
  duckdb_je_te_recompute_fast_threshold(tsd);
  return;
}

Assistant:

static void
te_adjust_thresholds_helper(tsd_t *tsd, te_ctx_t *ctx,
    uint64_t wait) {
	/*
	 * The next threshold based on future events can only be adjusted after
	 * progressing the last_event counter (which is set to current).
	 */
	assert(te_ctx_current_bytes_get(ctx) == te_ctx_last_event_get(ctx));
	assert(wait <= TE_MAX_START_WAIT);

	uint64_t next_event = te_ctx_last_event_get(ctx) + (wait <=
	    TE_MAX_INTERVAL ? wait : TE_MAX_INTERVAL);
	te_ctx_next_event_set(tsd, ctx, next_event);
}